

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall
PeleLM::getViscTerms(PeleLM *this,MultiFab *visc_terms,int src_comp,int num_comp,Real time)

{
  MultiFab **ppMVar1;
  Print *pPVar2;
  Print *x;
  int in_ECX;
  int in_EDX;
  Print *in_RSI;
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  Periodicity PVar3;
  int unaff_retaddr;
  int unaff_retaddr_00;
  Geometry *in_stack_00000008;
  MultiFab *in_stack_00000010;
  Real run_time;
  int IOProc;
  MultiFab *vel_visc_cc;
  TimeLevel whichTime;
  int viscComp;
  int dir;
  MultiFab **vel_visc;
  FluxBoxes fb;
  int nGrow;
  Real strt_time;
  int in_stack_00000ca4;
  MultiFab *in_stack_00000ca8;
  MultiFab **in_stack_00000cb0;
  Real in_stack_00000cb8;
  MultiFab *in_stack_00000cc0;
  Diffusion *in_stack_00000cc8;
  AmrLevel *in_stack_fffffffffffffc78;
  Print *in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc88;
  undefined1 cross;
  Periodicity *in_stack_fffffffffffffc90;
  undefined8 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcac;
  Print *in_stack_fffffffffffffcb0;
  long local_320;
  MultiFab *in_stack_fffffffffffffce8;
  Print *in_stack_fffffffffffffcf0;
  AmrLevel *in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  string *in_stack_fffffffffffffe58;
  double local_158;
  int local_14c;
  IntVect local_148;
  undefined8 local_138;
  int local_130;
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [32];
  long local_e0;
  TimeLevel local_d4;
  undefined4 local_d0;
  undefined1 local_c9 [33];
  string local_a8 [28];
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  string *in_stack_ffffffffffffff80;
  MultiFab *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  int local_60;
  int local_3c;
  double local_38;
  undefined8 local_30;
  int local_28;
  int local_24;
  Print *local_20;
  char *local_10;
  undefined8 in_stack_fffffffffffffff8;
  int ngrow;
  
  local_30 = in_XMM0_Qa;
  local_28 = in_ECX;
  local_24 = in_EDX;
  local_20 = in_RSI;
  local_38 = amrex::ParallelDescriptor::second();
  local_3c = amrex::FabArrayBase::nGrow((FabArrayBase *)local_20,0);
  amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffc80,
             (value_type)in_stack_fffffffffffffc78);
  ngrow = SUB84(in_stack_fffffffffffffff8,4);
  cross = (undefined1)((ulong)in_stack_fffffffffffffc88 >> 0x38);
  if (local_24 < 3) {
    if ((local_24 != 0) || (local_28 < 3)) {
      in_stack_fffffffffffffff8 = 0;
      amrex::Error_host((char *)in_stack_fffffffffffffc90);
    }
    FluxBoxes::FluxBoxes
              ((FluxBoxes *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,0,0x505d19);
    ppMVar1 = FluxBoxes::get((FluxBoxes *)&stack0xffffffffffffffb8);
    (**(code **)(*in_RDI + 400))(local_30,in_RDI,ppMVar1);
    for (local_60 = 0; ngrow = SUB84(in_stack_fffffffffffffff8,4),
        cross = (undefined1)((ulong)in_stack_fffffffffffffc88 >> 0x38), local_60 < 3;
        local_60 = local_60 + 1) {
      in_stack_fffffffffffffcf8 = (AmrLevel *)&stack0xffffffffffffff7f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff80,"velVT",(allocator *)in_stack_fffffffffffffcf8);
      in_stack_fffffffffffffce8 = ppMVar1[local_60];
      in_stack_fffffffffffffcf0 = (Print *)local_c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_c9 + 1),"velVT_viscn_",(allocator *)in_stack_fffffffffffffcf0);
      amrex::Concatenate(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                         in_stack_fffffffffffffe50);
      showMF(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
      std::__cxx11::string::~string(local_a8);
      std::__cxx11::string::~string((string *)(local_c9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_c9);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
    }
    local_d0 = 0;
    local_d4 = amrex::AmrLevel::which_time
                         (in_stack_fffffffffffffcf8,(int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                          (Real)in_stack_fffffffffffffce8);
    if (local_d4 == AmrOldTime) {
      local_320 = in_RDI[0x182];
    }
    else {
      local_320 = in_RDI[0x183];
    }
    local_e0 = local_320;
    Diffusion::getTensorViscTerms
              (in_stack_00000cc8,in_stack_00000cc0,in_stack_00000cb8,in_stack_00000cb0,
               in_stack_00000ca8,in_stack_00000ca4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"velVT",&local_101);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"velVT_visc_terms_1",&local_129);
    showMF(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
           in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    FluxBoxes::~FluxBoxes((FluxBoxes *)0x5060da);
  }
  else {
    local_10 = "Should only call getViscTerms for velocity";
    amrex::Abort_host((char *)in_stack_fffffffffffffc90);
  }
  if (0 < local_3c) {
    pPVar2 = local_20;
    PVar3 = amrex::Geometry::periodicity((Geometry *)in_stack_fffffffffffffcb0);
    local_148.vect._0_8_ = PVar3.period.vect._0_8_;
    local_138._0_4_ = local_148.vect[0];
    local_138._4_4_ = local_148.vect[1];
    local_148.vect[2] = PVar3.period.vect[2];
    local_130 = local_148.vect[2];
    local_148 = PVar3.period.vect;
    amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
              ((FabArray<amrex::FArrayBox> *)pPVar2,(int)((ulong)in_stack_fffffffffffffc98 >> 0x20),
               (int)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,(bool)cross);
    amrex::FabArrayBase::nGrow((FabArrayBase *)local_20,0);
    amrex::Extrapolater::FirstOrderExtrap
              (in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,ngrow);
    in_stack_fffffffffffffcac = local_28;
    in_stack_fffffffffffffcb0 = local_20;
  }
  if (2 < NavierStokesBase::verbose) {
    local_14c = amrex::ParallelDescriptor::IOProcessorNumber();
    local_158 = amrex::ParallelDescriptor::second();
    local_158 = local_158 - local_38;
    amrex::ParallelDescriptor::ReduceRealMax<double>(&local_158,local_14c);
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffffcb0,
                        (ostream *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    amrex::Print::operator<<(in_stack_fffffffffffffc80,(char (*) [36])in_stack_fffffffffffffc78);
    amrex::Print::operator<<(in_stack_fffffffffffffc80,(int *)in_stack_fffffffffffffc78);
    pPVar2 = amrex::Print::operator<<
                       (in_stack_fffffffffffffc80,(char (*) [9])in_stack_fffffffffffffc78);
    x = amrex::Print::operator<<(pPVar2,(double *)in_stack_fffffffffffffc78);
    amrex::Print::operator<<(pPVar2,(char *)x);
    amrex::Print::~Print(in_stack_fffffffffffffcf0);
  }
  return;
}

Assistant:

void
PeleLM::getViscTerms (MultiFab& visc_terms,
                      int       src_comp,
                      int       num_comp,
                      Real      time)
{
   BL_PROFILE("PLM::getViscTerms()");
   const Real strt_time = ParallelDescriptor::second();
   //
   // Load "viscous" terms, starting from component = 0.
   //
   // JFG: for species, this procedure returns the *negative* of the divergence of
   // of the diffusive fluxes.  specifically, in the mixture averaged case, the
   // diffusive flux vector for species k is
   //
   //       j_k = - rho D_k,mix grad Y_k
   //
   // so the divergence of the flux, div dot j_k, has a negative in it.  instead
   // this procedure returns - div dot j_k to remove the negative.
   //
   // note the fluxes used in the code are extensive, that is, scaled by the areas
   // of the cell edges.  the calculation of the divergence is the sum of un-divided
   // differences of the extensive fluxes, all divided by volume.  so the effect is
   // to give the true divided difference approximation to the divergence of the
   // intensive flux.

   const int  nGrow     = visc_terms.nGrow();
   //
   // Get Div(tau) from the tensor operator, if velocity and have non-const viscosity
   //
   visc_terms.setBndry(1.e30);
   if (src_comp < AMREX_SPACEDIM)
   {
      if (src_comp != Xvel || num_comp < AMREX_SPACEDIM)
         amrex::Error("tensor v -> getViscTerms needs all v-components at once");

      FluxBoxes fb(this);
      MultiFab** vel_visc = fb.get();
      getViscosity(vel_visc, time);

      for (int dir=0; dir<AMREX_SPACEDIM; ++dir) {
         showMF("velVT",*(vel_visc[dir]),amrex::Concatenate("velVT_viscn_",dir,1),level);
      }
      int viscComp = 0;
      const TimeLevel whichTime = which_time(State_Type,time);
      AMREX_ASSERT(whichTime == AmrOldTime || whichTime == AmrNewTime);
      auto vel_visc_cc = (whichTime == AmrOldTime ? viscn_cc : viscnp1_cc);
      diffusion->getTensorViscTerms(visc_terms,time,vel_visc,vel_visc_cc,viscComp);

      showMF("velVT",visc_terms,"velVT_visc_terms_1",level);
   }
   else
   {
     amrex::Abort("Should only call getViscTerms for velocity");
   }

   //
   // Ensure consistent grow cells
   //
   if (nGrow > 0)
   {
      visc_terms.FillBoundary(0,num_comp, geom.periodicity());
      Extrapolater::FirstOrderExtrap(visc_terms, geom, 0, num_comp, visc_terms.nGrow());
   }

   if (verbose > 2)
   {
      const int IOProc   = ParallelDescriptor::IOProcessorNumber();
      Real      run_time = ParallelDescriptor::second() - strt_time;

      ParallelDescriptor::ReduceRealMax(run_time,IOProc);

      amrex::Print() << "      PeleLM::getViscTerms(): lev: " << level
                     << ", time: " << run_time << '\n';
   }
}